

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  IfcElement *this_00;
  
  this_00 = (IfcElement *)
            &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x78;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x78 = 0x909270;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x60 = 0x9093b0;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x909298;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x110 = 0x9092c0;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x9092e8;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x178 = 0x909310;
  this[-1].MeshWidth.ptr = 4.68120875394314e-317;
  this[-1].LongitudinalBarNominalDiameter = 4.68122851656898e-317;
  this[-1].LongitudinalBarCrossSectionArea = 4.68124827919481e-317;
  if ((undefined1 *)this[-1].LongitudinalBarSpacing != &this[-1].field_0x1f0) {
    operator_delete((undefined1 *)this[-1].LongitudinalBarSpacing);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__00909038);
  operator_delete(this_00);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}